

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O2

void DumpAnchors(path *anchors_db_path,vector<CAddress,_std::allocator<CAddress>_> *anchors)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  string prefix;
  path src;
  string end_msg;
  path dest;
  bool bVar2;
  uint64_t uVar3;
  FILE *pFVar4;
  CChainParams *pCVar5;
  unsigned_short *args_1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  undefined8 in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  SerParams *pSVar6;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  pointer in_stack_fffffffffffffdb8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var7;
  pointer pbStack_240;
  pointer local_238;
  undefined6 uStack_230;
  uint16_t randv;
  AutoFile fileout;
  string local_1f8 [32];
  string local_1d8;
  string local_1b8 [32];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> logging_timer7;
  path local_138;
  path local_110;
  path pathTmp;
  string tmpfn;
  HashedSourceWriter<AutoFile> hashwriter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"DumpAnchors",(allocator<char> *)&fileout);
  hashwriter.super_HashWriter.ctx.s._0_8_ =
       ((long)(anchors->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_finish -
       (long)(anchors->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
             super__Vector_impl_data._M_start) / 0x38;
  tinyformat::format<unsigned_long>
            (&local_1d8,"Flush %d outbound block-relay-only peer addresses to anchors.dat",
             (unsigned_long *)&hashwriter);
  args_1 = (unsigned_short *)&DAT_00000001;
  prefix._M_string_length = in_stack_fffffffffffffda0;
  prefix._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd98;
  prefix.field_2._M_allocated_capacity = in_stack_fffffffffffffda8;
  prefix.field_2._8_8_ = in_stack_fffffffffffffdb0;
  end_msg._M_string_length = (size_type)pbStack_240;
  end_msg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdb8;
  end_msg.field_2._M_allocated_capacity = (size_type)local_238;
  end_msg.field_2._8_6_ = uStack_230;
  end_msg.field_2._14_2_ = randv;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Timer
            (&logging_timer7,prefix,end_msg,(LogFlags)local_1b8,SUB81(&local_1d8,0));
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"anchors",(allocator<char> *)&stack0xfffffffffffffdb7);
  pSVar6 = &CAddress::V2_DISK;
  FastRandomContext::FastRandomContext((FastRandomContext *)&hashwriter,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<16>
                    ((RandomMixin<FastRandomContext> *)&hashwriter);
  ChaCha20::~ChaCha20((ChaCha20 *)(hashwriter.super_HashWriter.ctx.s + 4));
  randv = (uint16_t)uVar3;
  tinyformat::format<std::__cxx11::string,unsigned_short>
            (&tmpfn,(tinyformat *)"%s.%04x",(char *)local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&randv,args_1);
  ArgsManager::GetDataDirNet((path *)&local_110,&gArgs);
  fs::u8path((path *)&hashwriter,&tmpfn);
  fs::operator/(&pathTmp,(path *)&local_110,(path *)&hashwriter);
  std::filesystem::__cxx11::path::~path((path *)&hashwriter);
  std::filesystem::__cxx11::path::~path(&local_110);
  pFVar4 = fsbridge::fopen((char *)&pathTmp,"wb");
  _Var7._M_head_impl = (_Impl *)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)pSVar6;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffffd98;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)anchors;
  AutoFile::AutoFile(&fileout,(FILE *)pFVar4,data_xor);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffdb8);
  if (fileout.m_file == (FILE *)0x0) {
    AutoFile::fclose(&fileout,pFVar4);
    std::filesystem::remove((path *)&pathTmp);
    std::filesystem::__cxx11::path::string((string *)&hashwriter,&pathTmp.super_path);
    logging_function_00._M_str = "SerializeFileDB";
    logging_function_00._M_len = 0xf;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
    ;
    source_file_00._M_len = 0x5a;
    LogPrintFormatInternal<char[16],std::__cxx11::string>
              (logging_function_00,source_file_00,0x42,ALL,Error,(ConstevalFormatString<2U>)0x6ca7ec
               ,(char (*) [16])"SerializeFileDB",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hashwriter);
  }
  else {
    HashedSourceWriter<AutoFile>::HashedSourceWriter(&hashwriter,&fileout);
    pCVar5 = Params();
    Serialize<HashedSourceWriter<AutoFile>,_unsigned_char,_4UL>
              (&hashwriter,&pCVar5->pchMessageStart);
    ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>const>::
    Serialize<HashedSourceWriter<AutoFile>>
              ((ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>const>
                *)&stack0xfffffffffffffda0,&hashwriter);
    HashWriter::GetHash((uint256 *)&local_138,&hashwriter.super_HashWriter);
    pFVar4 = (FILE *)&fileout;
    base_blob<256U>::Serialize<AutoFile>((base_blob<256U> *)&local_138,(AutoFile *)pFVar4);
    bVar2 = AutoFile::Commit(&fileout);
    if (bVar2) {
      AutoFile::fclose(&fileout,pFVar4);
      std::filesystem::__cxx11::path::path((path *)&hashwriter,&pathTmp.super_path);
      std::filesystem::__cxx11::path::path(&local_138,&anchors_db_path->super_path);
      src.super_path._M_pathname._M_string_length = (size_type)pSVar6;
      src.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd98;
      src.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)anchors;
      src.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffdb0;
      src.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )_Var7._M_head_impl;
      dest.super_path._M_pathname.field_2._M_allocated_capacity._0_6_ = uStack_230;
      dest.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
      dest.super_path._M_pathname._M_string_length = 0;
      dest.super_path._M_pathname.field_2._M_allocated_capacity._6_2_ = randv;
      dest.super_path._M_pathname.field_2._8_8_ = fileout.m_file;
      dest.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )fileout.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar2 = RenameOver(src,dest);
      std::filesystem::__cxx11::path::~path(&local_138);
      std::filesystem::__cxx11::path::~path((path *)&hashwriter);
      if (!bVar2) {
        std::filesystem::remove((path *)&pathTmp);
        logging_function._M_str = "SerializeFileDB";
        logging_function._M_len = 0xf;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
        ;
        source_file._M_len = 0x5a;
        LogPrintFormatInternal<char[16]>
                  (logging_function,source_file,0x57,ALL,Error,(ConstevalFormatString<1U>)0x6ca825,
                   (char (*) [16])"SerializeFileDB");
      }
      goto LAB_00395cdf;
    }
    AutoFile::fclose(&fileout,pFVar4);
    std::filesystem::remove((path *)&pathTmp);
    std::filesystem::__cxx11::path::string((string *)&hashwriter,&pathTmp.super_path);
    logging_function_01._M_str = "SerializeFileDB";
    logging_function_01._M_len = 0xf;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
    ;
    source_file_01._M_len = 0x5a;
    LogPrintFormatInternal<char[16],std::__cxx11::string>
              (logging_function_01,source_file_01,0x4f,ALL,Error,(ConstevalFormatString<2U>)0x6ca808
               ,(char (*) [16])"SerializeFileDB",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hashwriter);
  }
  std::__cxx11::string::~string((string *)&hashwriter);
LAB_00395cdf:
  AutoFile::~AutoFile(&fileout);
  std::filesystem::__cxx11::path::~path(&pathTmp.super_path);
  std::__cxx11::string::~string((string *)&tmpfn);
  std::__cxx11::string::~string(local_1f8);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~Timer(&logging_timer7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DumpAnchors(const fs::path& anchors_db_path, const std::vector<CAddress>& anchors)
{
    LOG_TIME_SECONDS(strprintf("Flush %d outbound block-relay-only peer addresses to anchors.dat", anchors.size()));
    SerializeFileDB("anchors", anchors_db_path, CAddress::V2_DISK(anchors));
}